

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

void __thiscall miniros::Subscription::addLocalConnection(Subscription *this,PublicationPtr *pub)

{
  Publication *this_00;
  int iVar1;
  RPCManagerPtr *pRVar2;
  value_type local_60;
  IntraProcessSubscriberLinkPtr sub_link;
  IntraProcessPublisherLinkPtr pub_link;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->publisher_links_mutex_);
  if (iVar1 == 0) {
    if (this->dropped_ == false) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (addLocalConnection::loc.initialized_ == false) {
        pub_link.super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&pub_link,"miniros.subscription","");
        console::initializeLogLocation(&addLocalConnection::loc,(string *)&pub_link,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pub_link.
               super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != &local_30) {
          operator_delete(pub_link.
                          super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_30._M_allocated_capacity + 1);
        }
      }
      if (addLocalConnection::loc.level_ != Debug) {
        console::setLogLocationLevel(&addLocalConnection::loc,Debug);
        console::checkLogLocationEnabled(&addLocalConnection::loc);
      }
      if (addLocalConnection::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,addLocalConnection::loc.logger_,
                       addLocalConnection::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0xc5,
                       "void miniros::Subscription::addLocalConnection(const PublicationPtr &)",
                       "Creating intraprocess link for topic [%s]",(this->name_)._M_dataplus._M_p);
      }
      std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Subscription,void>
                ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)&sub_link,
                 (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<miniros::Subscription>);
      pRVar2 = RPCManager::instance();
      std::__shared_ptr<miniros::IntraProcessPublisherLink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::IntraProcessPublisherLink>,std::shared_ptr<miniros::Subscription>,std::__cxx11::string_const&,miniros::TransportHints&>
                ((__shared_ptr<miniros::IntraProcessPublisherLink,(__gnu_cxx::_Lock_policy)2> *)
                 &pub_link,(allocator<miniros::IntraProcessPublisherLink> *)&local_60,
                 (shared_ptr<miniros::Subscription> *)&sub_link,
                 &((pRVar2->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->uri_,&this->transport_hints_);
      if (sub_link.
          super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sub_link.
                   super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__shared_ptr<miniros::IntraProcessSubscriberLink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::IntraProcessSubscriberLink>,std::shared_ptr<miniros::Publication>const&>
                ((__shared_ptr<miniros::IntraProcessSubscriberLink,(__gnu_cxx::_Lock_policy)2> *)
                 &sub_link,(allocator<miniros::IntraProcessSubscriberLink> *)&local_60,pub);
      IntraProcessPublisherLink::setPublisher
                (pub_link.
                 super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&sub_link);
      IntraProcessSubscriberLink::setSubscriber
                (sub_link.
                 super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&pub_link);
      local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(pub_link.
             super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_PublisherLink;
      local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = pub_link.
              super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (pub_link.
          super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (pub_link.
           super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (pub_link.
                super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (pub_link.
           super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (pub_link.
                super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
      ::push_back(&this->publisher_links_,&local_60);
      if (local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this_00 = (pub->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           sub_link.
           super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = sub_link.
              super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (sub_link.
          super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (sub_link.
           super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (sub_link.
                super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (sub_link.
           super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (sub_link.
                super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Publication::addSubscriberLink(this_00,(SubscriberLinkPtr *)&local_60);
      if (local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (sub_link.
          super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sub_link.
                   super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (pub_link.
          super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pub_link.
                   super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Subscription::addLocalConnection(const PublicationPtr& pub)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
  if (dropped_)
  {
    return;
  }

  MINIROS_DEBUG("Creating intraprocess link for topic [%s]", name_.c_str());

  IntraProcessPublisherLinkPtr pub_link(std::make_shared<IntraProcessPublisherLink>(shared_from_this(), RPCManager::instance()->getServerURI(), transport_hints_));
  IntraProcessSubscriberLinkPtr sub_link(std::make_shared<IntraProcessSubscriberLink>(pub));
  pub_link->setPublisher(sub_link);
  sub_link->setSubscriber(pub_link);

  addPublisherLink(pub_link);
  pub->addSubscriberLink(sub_link);
}